

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cc
# Opt level: O2

int __thiscall Server::listen(Server *this,int __fd,int __n)

{
  ushort uVar1;
  int *piVar2;
  pointer piVar3;
  byte bVar4;
  bool bVar5;
  uint __i;
  int iVar6;
  long lVar7;
  ssize_t sVar8;
  runtime_error *prVar9;
  int *piVar10;
  char *pcVar11;
  uint uVar12;
  ulong uVar13;
  fd_set *pfVar14;
  fd_set *pfVar15;
  __normal_iterator<std::shared_ptr<ClientSocket>_*,_std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>_>
  __it;
  uint uVar16;
  __normal_iterator<std::shared_ptr<ClientSocket>_*,_std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>_>
  _Var17;
  int *fileDescriptor;
  long lVar18;
  byte bVar19;
  int local_1bc;
  ulong local_1b8;
  uint local_1ac;
  pthread_mutex_t *local_1a8;
  int clientFileDescriptor;
  shared_ptr<ClientSocket> *local_198;
  shared_ptr<ClientSocket> clientSocket;
  unsigned_long clientAddressLength;
  sockaddr_in clientAddress;
  future<void> result;
  sockaddr_in socketAddress;
  fd_set masterSocketSet;
  fd_set clientSocketSet;
  
  bVar19 = 0;
  iVar6 = socket(2,1,0);
  this->_socket = iVar6;
  if (iVar6 == -1) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    piVar10 = __errno_location();
    pcVar11 = strerror(*piVar10);
    std::__cxx11::string::string((string *)&masterSocketSet,pcVar11,(allocator *)&clientSocketSet);
    std::runtime_error::runtime_error(prVar9,(string *)&masterSocketSet);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  masterSocketSet.fds_bits[0]._0_4_ = 1;
  setsockopt(iVar6,1,2,&masterSocketSet,4);
  for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
    socketAddress.sin_zero[lVar7 + -8] = '\0';
  }
  socketAddress.sin_family = 2;
  socketAddress.sin_addr.s_addr = 0;
  uVar1 = (ushort)this->_port;
  socketAddress.sin_port = uVar1 << 8 | uVar1 >> 8;
  iVar6 = bind(this->_socket,(sockaddr *)&socketAddress,0x10);
  if (iVar6 == -1) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    piVar10 = __errno_location();
    pcVar11 = strerror(*piVar10);
    std::__cxx11::string::string((string *)&masterSocketSet,pcVar11,(allocator *)&clientSocketSet);
    std::runtime_error::runtime_error(prVar9,(string *)&masterSocketSet);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar6 = ::listen(this->_socket,this->_backlog);
  if (iVar6 == -1) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    piVar10 = __errno_location();
    pcVar11 = strerror(*piVar10);
    std::__cxx11::string::string((string *)&masterSocketSet,pcVar11,(allocator *)&clientSocketSet);
    std::runtime_error::runtime_error(prVar9,(string *)&masterSocketSet);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
    masterSocketSet.fds_bits[lVar7] = 0;
  }
  uVar12 = this->_socket;
  uVar13 = (ulong)uVar12;
  masterSocketSet.fds_bits[(int)uVar12 / 0x40] =
       masterSocketSet.fds_bits[(int)uVar12 / 0x40] | 1L << ((byte)uVar12 & 0x3f);
  local_1a8 = (pthread_mutex_t *)&this->_staleFileDescriptorsMutex;
  do {
    pfVar14 = &masterSocketSet;
    pfVar15 = (fd_set *)&clientSocketSet;
    for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
      pfVar15->fds_bits[0] = pfVar14->fds_bits[0];
      pfVar14 = (fd_set *)((long)pfVar14 + ((ulong)bVar19 * -2 + 1) * 8);
      pfVar15 = (fd_set *)((long)pfVar15 + ((ulong)bVar19 * -2 + 1) * 8);
    }
    iVar6 = select((uint)uVar13 + 1,(fd_set *)&clientSocketSet,(fd_set *)0x0,(fd_set *)0x0,
                   (timeval *)0x0);
    if (iVar6 == -1) {
      return -1;
    }
    local_1bc = 0;
    local_1b8 = uVar13;
    local_1ac = (uint)uVar13;
    while( true ) {
      uVar12 = (uint)uVar13;
      if ((int)uVar12 < local_1bc) break;
      if (((ulong)clientSocketSet.fds_bits[local_1bc / 0x40] >> ((long)local_1bc % 0x40 & 0x3fU) & 1
          ) != 0) {
        if (local_1bc == this->_socket) {
          clientAddressLength = 0x10;
          clientFileDescriptor =
               accept(local_1bc,(sockaddr *)&clientAddress,(socklen_t *)&clientAddressLength);
          if (clientFileDescriptor == 0xffffffff) break;
          masterSocketSet.fds_bits[clientFileDescriptor / 0x40] =
               masterSocketSet.fds_bits[clientFileDescriptor / 0x40] |
               1L << ((byte)clientFileDescriptor & 0x3f);
          uVar16 = clientFileDescriptor;
          if (clientFileDescriptor < (int)uVar12) {
            uVar16 = uVar12;
          }
          std::make_shared<ClientSocket,int&,Server&>
                    ((int *)&clientSocket,(Server *)&clientFileDescriptor);
          if ((this->_handleAccept).super__Function_base._M_manager != (_Manager_type)0x0) {
            std::
            async<std::function<void(std::weak_ptr<ClientSocket>)>&,std::shared_ptr<ClientSocket>&>
                      ((launch)&result,(function<void_(std::weak_ptr<ClientSocket>)> *)0x1,
                       (shared_ptr<ClientSocket> *)&this->_handleAccept);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&result.super___basic_future<void>._M_state.
                        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
          }
          std::
          vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>::
          push_back(&this->_clientSockets,&clientSocket);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&clientSocket.super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          local_1ac = uVar16;
        }
        else {
          clientSocket.super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_2_ = 0
          ;
          sVar8 = recv(local_1bc,&clientSocket,1,2);
          if ((int)sVar8 < 1) {
            close(this,local_1bc);
          }
          else {
            __it._M_current =
                 (this->_clientSockets).
                 super__Vector_base<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_198 = (this->_clientSockets).
                        super__Vector_base<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            clientAddress._0_8_ = &local_1bc;
            lVar18 = (long)local_198 - (long)__it._M_current;
            for (lVar7 = lVar18 >> 6; uVar13 = local_1b8, 0 < lVar7; lVar7 = lVar7 + -1) {
              bVar5 = __gnu_cxx::__ops::_Iter_pred<Server::listen()::$_0>::operator()
                                ((_Iter_pred<Server::listen()::__0> *)&clientAddress,__it);
              uVar13 = local_1b8;
              _Var17._M_current = __it._M_current;
              if (bVar5) goto LAB_0010ac9f;
              bVar5 = __gnu_cxx::__ops::_Iter_pred<Server::listen()::$_0>::operator()
                                ((_Iter_pred<Server::listen()::__0> *)&clientAddress,
                                 __it._M_current + 1);
              uVar13 = local_1b8;
              _Var17._M_current = __it._M_current + 1;
              if (bVar5) goto LAB_0010ac9f;
              bVar5 = __gnu_cxx::__ops::_Iter_pred<Server::listen()::$_0>::operator()
                                ((_Iter_pred<Server::listen()::__0> *)&clientAddress,
                                 __it._M_current + 2);
              uVar13 = local_1b8;
              _Var17._M_current = __it._M_current + 2;
              if (bVar5) goto LAB_0010ac9f;
              bVar5 = __gnu_cxx::__ops::_Iter_pred<Server::listen()::$_0>::operator()
                                ((_Iter_pred<Server::listen()::__0> *)&clientAddress,
                                 __it._M_current + 3);
              uVar13 = local_1b8;
              _Var17._M_current = __it._M_current + 3;
              if (bVar5) goto LAB_0010ac9f;
              __it._M_current = __it._M_current + 4;
              lVar18 = lVar18 + -0x40;
            }
            lVar18 = lVar18 >> 4;
            if (lVar18 == 1) {
LAB_0010ad07:
              bVar5 = __gnu_cxx::__ops::_Iter_pred<Server::listen()::$_0>::operator()
                                ((_Iter_pred<Server::listen()::__0> *)&clientAddress,__it);
              _Var17._M_current = local_198;
              if (bVar5) {
                _Var17._M_current = __it._M_current;
              }
            }
            else if (lVar18 == 2) {
LAB_0010acdd:
              bVar5 = __gnu_cxx::__ops::_Iter_pred<Server::listen()::$_0>::operator()
                                ((_Iter_pred<Server::listen()::__0> *)&clientAddress,__it);
              _Var17._M_current = __it._M_current;
              if (!bVar5) {
                __it._M_current = __it._M_current + 1;
                goto LAB_0010ad07;
              }
            }
            else {
              _Var17._M_current = local_198;
              if ((lVar18 == 3) &&
                 (bVar5 = __gnu_cxx::__ops::_Iter_pred<Server::listen()::$_0>::operator()
                                    ((_Iter_pred<Server::listen()::__0> *)&clientAddress,__it),
                 _Var17._M_current = __it._M_current, !bVar5)) {
                __it._M_current = __it._M_current + 1;
                goto LAB_0010acdd;
              }
            }
LAB_0010ac9f:
            if ((_Var17._M_current !=
                 (this->_clientSockets).
                 super__Vector_base<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) &&
               ((this->_handleRead).super__Function_base._M_manager != (_Manager_type)0x0)) {
              std::
              async<std::function<void(std::weak_ptr<ClientSocket>)>&,std::shared_ptr<ClientSocket>&>
                        ((launch)&clientAddress,(function<void_(std::weak_ptr<ClientSocket>)> *)0x1,
                         (shared_ptr<ClientSocket> *)&this->_handleRead);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)clientAddress.sin_zero);
            }
          }
        }
      }
      local_1bc = local_1bc + 1;
    }
    uVar13 = uVar13 & 0xffffffff;
    if ((int)uVar12 < (int)local_1ac) {
      uVar13 = (ulong)local_1ac;
    }
    std::mutex::lock((mutex *)&local_1a8->__data);
    piVar2 = (this->_staleFileDescriptors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar10 = (this->_staleFileDescriptors).super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start; piVar10 != piVar2;
        piVar10 = piVar10 + 1) {
      iVar6 = *piVar10;
      bVar4 = (byte)iVar6 & 0x3f;
      masterSocketSet.fds_bits[iVar6 / 0x40] =
           masterSocketSet.fds_bits[iVar6 / 0x40] &
           (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
      ::close(iVar6);
    }
    piVar3 = (this->_staleFileDescriptors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->_staleFileDescriptors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar3) {
      (this->_staleFileDescriptors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar3;
    }
    pthread_mutex_unlock(local_1a8);
  } while( true );
}

Assistant:

void Server::listen()
{
  _socket = socket( AF_INET, SOCK_STREAM, 0 );

  if( _socket == -1 )
    throw std::runtime_error( std::string( strerror( errno ) ) );

  {
    int option = 1;

    setsockopt( _socket,
                SOL_SOCKET,
                SO_REUSEADDR,
                reinterpret_cast<const void*>( &option ),
                sizeof( option ) );
  }

  sockaddr_in socketAddress;

  std::fill( reinterpret_cast<char*>( &socketAddress ),
             reinterpret_cast<char*>( &socketAddress ) + sizeof( socketAddress ),
             0 );

  socketAddress.sin_family      = AF_INET;
  socketAddress.sin_addr.s_addr = htonl( INADDR_ANY );
  socketAddress.sin_port        = htons( _port );

  {
    int result = bind( _socket,
                       reinterpret_cast<const sockaddr*>( &socketAddress ),
                       sizeof( socketAddress ) );

    if( result == -1 )
      throw std::runtime_error( std::string( strerror( errno ) ) );
  }

  {
    int result = ::listen( _socket, _backlog );

    if( result == -1 )
      throw std::runtime_error( std::string( strerror( errno ) ) );
  }

  fd_set masterSocketSet;
  fd_set clientSocketSet;

  FD_ZERO( &masterSocketSet );
  FD_SET( _socket, &masterSocketSet );

  int highestFileDescriptor = _socket;

  while( 1 )
  {
    clientSocketSet = masterSocketSet;

    int numFileDescriptors = select( highestFileDescriptor + 1,
                                     &clientSocketSet,
                                     nullptr,   // no descriptors to write into
                                     nullptr,   // no descriptors with exceptions
                                     nullptr ); // no timeout

    if( numFileDescriptors == -1 )
      break;

    // Will be updated in the loop as soon as a new client has been
    // accepted. This saves us from modifying the variable *during*
    // the loop execution.
    int newHighestFileDescriptor = highestFileDescriptor;

    for( int i = 0; i <= highestFileDescriptor; i++ )
    {
      if( !FD_ISSET( i, &clientSocketSet ) )
        continue;

      // Handle new client
      if( i == _socket )
      {
        sockaddr_in clientAddress;
        auto clientAddressLength = sizeof(clientAddress);

        int clientFileDescriptor = accept( _socket,
                                           reinterpret_cast<sockaddr*>( &clientAddress ),
                                           reinterpret_cast<socklen_t*>( &clientAddressLength ) );

        if( clientFileDescriptor == -1 )
          break;

        FD_SET( clientFileDescriptor, &masterSocketSet );
        newHighestFileDescriptor = std::max( highestFileDescriptor, clientFileDescriptor );

        auto clientSocket = std::make_shared<ClientSocket>( clientFileDescriptor, *this );

        if( _handleAccept )
          auto result = std::async( std::launch::async, _handleAccept, clientSocket );

        _clientSockets.push_back( clientSocket );
      }

      // Known client socket
      else
      {
        char buffer[2] = {0,0};

        // Let's attempt to read at least one byte from the connection, but
        // without removing it from the queue. That way, the server can see
        // whether a client has closed the connection.
        int result = recv( i, buffer, 1, MSG_PEEK );

        if( result <= 0 )
        {
          // It would be easier to use erase-remove here, but this leads
          // to a deadlock. Instead, the current socket will be added to
          // the list of stale sockets and be closed later on.
          this->close( i );
        }
        else
        {
          auto itSocket = std::find_if( _clientSockets.begin(), _clientSockets.end(),
                                        [&] ( std::shared_ptr<ClientSocket> socket )
                                        {
                                          return socket->fileDescriptor() == i;
                                        } );

          if( itSocket != _clientSockets.end() && _handleRead )
            auto result = std::async( std::launch::async, _handleRead, *itSocket );
        }
      }
    }

    // Update the file descriptor if a new client has been accepted in
    // the loop above.
    highestFileDescriptor = std::max( newHighestFileDescriptor, highestFileDescriptor );

    // Handle stale connections. This is in an extra scope so that the
    // lock guard unlocks the mutex automatically.
    {
      std::lock_guard<std::mutex> lock( _staleFileDescriptorsMutex );

      for( auto&& fileDescriptor : _staleFileDescriptors )
      {
        FD_CLR( fileDescriptor, &masterSocketSet );
        ::close( fileDescriptor );
      }

      _staleFileDescriptors.clear();
    }
  }
}